

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_encryptdict.c
# Opt level: O3

HPDF_EncryptDict HPDF_EncryptDict_New(HPDF_MMgr mmgr,HPDF_Xref xref)

{
  byte *pbVar1;
  HPDF_Dict dict;
  HPDF_Encrypt attr;
  HPDF_STATUS HVar2;
  
  dict = HPDF_Dict_New(mmgr);
  if (dict != (HPDF_Dict)0x0) {
    pbVar1 = (byte *)((long)&(dict->header).obj_class + 1);
    *pbVar1 = *pbVar1 | 9;
    dict->free_fn = HPDF_EncryptDict_OnFree;
    attr = (HPDF_Encrypt)HPDF_GetMem(dict->mmgr,0x1c4);
    if (attr != (HPDF_Encrypt)0x0) {
      dict->attr = attr;
      HPDF_Encrypt_Init(attr);
      HVar2 = HPDF_Xref_Add(xref,dict);
      if (HVar2 != 0) {
        return (HPDF_EncryptDict)0x0;
      }
      return dict;
    }
    HPDF_Dict_Free(dict);
  }
  return (HPDF_EncryptDict)0x0;
}

Assistant:

HPDF_EncryptDict
HPDF_EncryptDict_New  (HPDF_MMgr  mmgr,
                       HPDF_Xref  xref)
{
    HPDF_Encrypt attr;
    HPDF_EncryptDict dict;

    HPDF_PTRACE((" HPDF_EncryptDict_New\n"));

    dict = HPDF_Dict_New (mmgr);
    if (!dict)
        return NULL;

    dict->header.obj_class |= HPDF_OSUBCLASS_ENCRYPT;
    dict->free_fn = HPDF_EncryptDict_OnFree;

    attr = HPDF_GetMem (dict->mmgr, sizeof(HPDF_Encrypt_Rec));
    if (!attr) {
        HPDF_Dict_Free (dict);
        return NULL;
    }

    dict->attr = attr;
    HPDF_Encrypt_Init (attr);

    if (HPDF_Xref_Add (xref, dict) != HPDF_OK)
        return NULL;

    return dict;
}